

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

void __thiscall
cnn::FoldRows::backward_impl
          (FoldRows *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  variable_if_dynamic<long,__1> vVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  ulong local_80;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  uVar8 = (ulong)(fx->d).d[0];
  Tensor::operator*(&local_50,dEdf);
  Tensor::operator*(&local_70,dEdxi);
  if (uVar8 != 0) {
    uVar1 = this->nrows;
    bVar9 = local_50.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data != (float *)0x0;
    local_80 = 0;
    uVar5 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        if (local_50.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value < 0 && bVar9) {
LAB_0017c59d:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, Level = 0]"
                       );
        }
        uVar7 = 0;
        uVar3 = local_80;
        do {
          if (local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value <= (long)uVar5) {
LAB_0017c57e:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::Block(XprType &, Index) [XprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                         );
          }
          if (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data != (PointerType)0x0 &&
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value < 0) goto LAB_0017c59d;
          if (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value <= (long)(ulong)((int)uVar5 * uVar1 + (int)uVar7)) goto LAB_0017c57e;
          if (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value !=
              local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, SrcXprType = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>, Functor = Eigen::internal::add_assign_op<float, float>]"
                         );
          }
          if (0 < local_70.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_cols.m_value) {
            pfVar4 = local_70.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data + uVar3;
            pfVar2 = local_50.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data;
            vVar6.m_value =
                 local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value;
            do {
              *pfVar4 = *pfVar4 + *pfVar2;
              pfVar2 = pfVar2 + local_50.
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_rows.m_value;
              pfVar4 = pfVar4 + local_70.
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_rows.m_value;
              vVar6.m_value = vVar6.m_value + -1;
            } while (vVar6.m_value != 0);
          }
          uVar7 = uVar7 + 1;
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (uVar7 != uVar1);
      }
      uVar5 = uVar5 + 1;
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_50.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data + 1;
      local_80 = (ulong)((int)local_80 + uVar1);
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

void FoldRows::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("AddVectorToAllColumns::backward not implemented for CUDA");
#else
  unsigned orows = fx.d.rows();
  auto d = *dEdf;
  auto di = *dEdxi;
  for (unsigned i = 0; i < orows; ++i)
    for (unsigned j = 0; j < nrows; ++j)
      di.row(i * nrows + j) += d.row(i);
#endif
}